

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

void __thiscall
slang::ast::SimpleAssertionExpr::requireSequence
          (SimpleAssertionExpr *this,ASTContext *context,DiagCode code)

{
  SourceRange sourceRange;
  bool bVar1;
  AssertionInstanceExpression *context_00;
  undefined4 in_EDX;
  AssertionExpr *in_RSI;
  long in_RDI;
  SourceRange SVar2;
  SyntaxNode *unaff_retaddr;
  AssertionInstanceExpression *aie;
  undefined4 in_stack_ffffffffffffffd8;
  DiagCode code_00;
  
  if (**(int **)(in_RDI + 0x10) == 0x27) {
    context_00 = Expression::as<slang::ast::AssertionInstanceExpression>
                           (*(Expression **)(in_RDI + 0x10));
    code_00 = SUB84((ulong)in_RDI >> 0x20,0);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x7d1dba);
    bVar1 = Type::isPropertyType((Type *)0x7d1dc2);
    if (bVar1) {
      SVar2 = slang::syntax::SyntaxNode::sourceRange(unaff_retaddr);
      sourceRange.endLoc._0_4_ = in_stack_ffffffffffffffd8;
      sourceRange.startLoc = SVar2.endLoc;
      sourceRange.endLoc._4_4_ = in_EDX;
      ASTContext::addDiag((ASTContext *)SVar2.startLoc,SUB84((ulong)context_00 >> 0x20,0),
                          sourceRange);
    }
    else {
      AssertionExpr::requireSequence(in_RSI,(ASTContext *)context_00,code_00);
    }
  }
  return;
}

Assistant:

void SimpleAssertionExpr::requireSequence(const ASTContext& context, DiagCode code) const {
    if (expr.kind == ExpressionKind::AssertionInstance) {
        auto& aie = expr.as<AssertionInstanceExpression>();
        if (aie.type->isPropertyType()) {
            SLANG_ASSERT(syntax);
            context.addDiag(code, syntax->sourceRange());
            return;
        }

        aie.body.requireSequence(context, code);
    }
}